

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warm_cb.cc
# Opt level: O0

void predict_or_learn_adf<true,false>(warm_cb *data,multi_learner *base,example *ec)

{
  uint32_t uVar1;
  long in_RDX;
  example *in_RSI;
  multi_learner *in_RDI;
  int in_stack_000001bc;
  example *in_stack_000001c0;
  multi_learner *in_stack_000001c8;
  warm_cb *in_stack_000001d0;
  
  *(undefined8 *)(in_RDI + 0x13c) = *(undefined8 *)(in_RDX + 0x6828);
  if (*(uint *)(in_RDI + 0x134) < *(uint *)(in_RDI + 0x78)) {
    uVar1 = corrupt_action((warm_cb *)ec,(uint32_t)((ulong)in_RDI >> 0x20),(int)in_RDI);
    *(uint32_t *)(in_RDX + 0x6828) = uVar1;
  }
  if (*(uint *)(in_RDI + 0x134) < *(uint *)(in_RDI + 0x78)) {
    if (*(int *)(in_RDI + 0xa0) == 1) {
      predict_or_learn_sup_adf<false>((warm_cb *)ec,in_RDI,in_RSI,(int)((ulong)in_RDX >> 0x20));
    }
    else if (*(int *)(in_RDI + 0xa0) == 2) {
      predict_or_learn_bandit_adf<false>
                (in_stack_000001d0,in_stack_000001c8,in_stack_000001c0,in_stack_000001bc);
    }
    *(undefined4 *)(in_RDX + 0x6870) = 0;
    *(int *)(in_RDI + 0x134) = *(int *)(in_RDI + 0x134) + 1;
  }
  else if (*(uint *)(in_RDI + 0x138) < *(uint *)(in_RDI + 0x7c)) {
    predict_or_learn_bandit_adf<false>
              (in_stack_000001d0,in_stack_000001c8,in_stack_000001c0,in_stack_000001bc);
    accumu_var_adf(data,base,ec);
    v_array<ACTION_SCORE::action_score>::clear((v_array<ACTION_SCORE::action_score> *)in_RSI);
    *(int *)(in_RDI + 0x138) = *(int *)(in_RDI + 0x138) + 1;
  }
  else {
    *(undefined4 *)(in_RDX + 0x6870) = 0;
    *(undefined4 *)(in_RDX + 0x6850) = 1;
  }
  *(undefined8 *)(in_RDX + 0x6828) = *(undefined8 *)(in_RDI + 0x13c);
  return;
}

Assistant:

void predict_or_learn_adf(warm_cb& data, multi_learner& base, example& ec)
{
	// Corrupt labels (only corrupting multiclass labels as of now)
	if (use_cs)
		data.cs_label = ec.l.cs;
	else
	{
		data.mc_label = ec.l.multi;
		if (data.ws_iter < data.ws_period)
			ec.l.multi.label = corrupt_action(data, data.mc_label.label, WARM_START);
	}

	// Warm start phase
	if (data.ws_iter < data.ws_period)
	{
			if (data.ws_type == SUPERVISED_WS)
				predict_or_learn_sup_adf<use_cs>(data, base, ec, WARM_START);
			else if (data.ws_type == BANDIT_WS)
				predict_or_learn_bandit_adf<use_cs>(data, base, ec, WARM_START);

		ec.weight = 0;
		data.ws_iter++;
	}
	// Interaction phase
	else if (data.inter_iter < data.inter_period)
	{
		predict_or_learn_bandit_adf<use_cs>(data, base, ec, INTERACTION);
		accumu_var_adf(data, base, ec);
		data.a_s_adf.clear();
		data.inter_iter++;
	}
	// Skipping the rest of the examples
	else
	{
    ec.weight = 0;
    ec.pred.multiclass = 1;
  }

	// Restore the original labels
	if (use_cs)
		ec.l.cs = data.cs_label;
	else
		ec.l.multi = data.mc_label;

}